

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

Vec_Wec_t * Vec_WecAlloc(int nCap)

{
  Vec_Wec_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  
  pVVar1 = (Vec_Wec_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < nCap - 1U) {
    iVar3 = nCap;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar3;
  if (iVar3 == 0) {
    pVVar2 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar2 = (Vec_Int_t *)calloc((long)iVar3,0x10);
  }
  pVVar1->pArray = pVVar2;
  return pVVar1;
}

Assistant:

static inline Vec_Wec_t * Vec_WecAlloc( int nCap )
{
    Vec_Wec_t * p;
    p = ABC_ALLOC( Vec_Wec_t, 1 );
    if ( nCap > 0 && nCap < 8 )
        nCap = 8;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_CALLOC( Vec_Int_t, p->nCap ) : NULL;
    return p;
}